

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O0

AssertionResult __thiscall
testing::internal::
CmpHelperEQ<std::tuple<int,int,char_const*,int,int,double>,std::tuple<int,int,char_const*,int,int,double>>
          (internal *this,char *expected_expression,char *actual_expression,
          tuple<int,_int,_const_char_*,_int,_int,_double> *expected,
          tuple<int,_int,_const_char_*,_int,_int,_double> *actual)

{
  bool bVar1;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  AssertionResult AVar3;
  tuple<int,_int,_const_char_*,_int,_int,_double> *actual_local;
  tuple<int,_int,_const_char_*,_int,_int,_double> *expected_local;
  char *actual_expression_local;
  char *expected_expression_local;
  
  bVar1 = std::operator==(expected,actual);
  if (bVar1) {
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
    AVar3 = CmpHelperEQFailure<std::tuple<int,int,char_const*,int,int,double>,std::tuple<int,int,char_const*,int,int,double>>
                      (this,expected_expression,actual_expression,expected,actual);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
GTEST_DISABLE_MSC_WARNINGS_PUSH_(4389 /* signed/unsigned mismatch */)
  if (expected == actual) {
    return AssertionSuccess();
  }
GTEST_DISABLE_MSC_WARNINGS_POP_()

  return CmpHelperEQFailure(expected_expression, actual_expression, expected,
                            actual);
}